

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::SetIntFrcCalcMethod
          (ChElementHexaANCF_3843 *this,IntFrcMethod method)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  this->m_method = method;
  lVar1 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols * (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  lVar2 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  lVar3 = lVar2 + lVar1;
  if (lVar3 == 0 || SCARRY8(lVar2,lVar1) != lVar3 < 0) {
    return;
  }
  PrecomputeInternalForceMatricesWeights(this);
  return;
}

Assistant:

void ChElementHexaANCF_3843::SetIntFrcCalcMethod(IntFrcMethod method) {
    m_method = method;

    // Check to see if SetupInitial has already been called (i.e. at least one set of precomputed matrices has been
    // populated).  If so, the precomputed matrices will need to be generated if they do not already exist or
    // regenerated if they have to ensure they are in sync with any other element changes.
    if (m_SD.size() + m_O1.size() > 0) {
        PrecomputeInternalForceMatricesWeights();
    }
}